

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::InvalidateDefaultFramebufferRenderCase::render
          (InvalidateDefaultFramebufferRenderCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 program;
  uint uVar1;
  int width;
  int height;
  Context *pCVar2;
  deUint32 *attachments_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  FlatColorShader flatShader;
  Vec4 local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  Vec3 local_188;
  ShaderProgram local_178;
  
  FboTestUtil::FlatColorShader::FlatColorShader((FlatColorShader *)&local_178,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments(&local_1a0,this->m_buffers);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar2->_vptr_Context[0x75])(pCVar2,&local_178);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 0.0;
  local_1b8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)&local_178,pCVar2,program,&local_1b8);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data[2] = -1.0;
  local_188.m_data[0] = 1.0;
  local_188.m_data[1] = 1.0;
  local_188.m_data[2] = 1.0;
  sglr::drawQuad(pCVar2,program,(Vec3 *)&local_1b8,&local_188);
  attachments_00 = (deUint32 *)0x0;
  if ((long)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    attachments_00 =
         local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  sglr::ContextWrapper::glInvalidateFramebuffer
            (this_00,this->m_fboTarget,
             (int)((ulong)((long)local_1a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1a0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),attachments_00);
  uVar1 = this->m_buffers;
  if ((uVar1 >> 0xe & 1) != 0) {
    sglr::ContextWrapper::glDisable(this_00,0xb71);
    sglr::ContextWrapper::glDisable(this_00,0xb90);
    pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1b8.m_data[0] = 0.0;
    local_1b8.m_data[1] = 1.0;
    local_1b8.m_data[2] = 0.0;
    local_1b8.m_data[3] = 1.0;
    FboTestUtil::FlatColorShader::setColor((FlatColorShader *)&local_178,pCVar2,program,&local_1b8);
    pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1b8.m_data[0] = -1.0;
    local_1b8.m_data[1] = -1.0;
    local_1b8.m_data._8_8_ = local_1b8.m_data._8_8_ & 0xffffffff00000000;
    local_188.m_data[0] = 1.0;
    local_188.m_data[1] = 1.0;
    local_188.m_data[2] = 0.0;
    sglr::drawQuad(pCVar2,program,(Vec3 *)&local_1b8,&local_188);
    sglr::ContextWrapper::glEnable(this_00,0xb71);
    sglr::ContextWrapper::glEnable(this_00,0xb90);
    uVar1 = this->m_buffers;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    sglr::ContextWrapper::glDepthFunc(this_00,0x207);
    uVar1 = this->m_buffers;
  }
  if ((uVar1 >> 10 & 1) == 0) {
    sglr::ContextWrapper::glStencilFunc(this_00,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 1.0;
  local_1b8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)&local_178,pCVar2,program,&local_1b8);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data._8_8_ = local_1b8.m_data._8_8_ & 0xffffffff00000000;
  local_188.m_data[0] = 1.0;
  local_188.m_data[1] = 1.0;
  local_188.m_data[2] = 0.0;
  sglr::drawQuad(pCVar2,program,(Vec3 *)&local_1b8,&local_188);
  width = sglr::ContextWrapper::getWidth(this_00);
  height = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,width,height);
  if (local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (deUint32 *)0x0) {
    operator_delete(local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&local_178);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		FlatColorShader		flatShader	(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments	= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID= getCurrentContext()->createProgram(&flatShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateFramebuffer(m_fboTarget, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0]);

		if ((m_buffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if ((m_buffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_buffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}